

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_estimator.c
# Opt level: O1

void WebRtcIsac_InitializePitch
               (double *in,double old_lag,double old_gain,PitchAnalysisStruct *State,double *lags)

{
  long lVar1;
  long lVar2;
  double dVar3;
  undefined1 *puVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  undefined1 *puVar15;
  ulong uVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double lags1 [10];
  double lags2 [10];
  int peaks [10];
  double *CorrSurf [25];
  double peak_vals [10];
  double corrvec1 [65];
  double corrvec2 [65];
  double buf_dec [192];
  double corrSurfBuff [1735];
  double local_4278 [10];
  double local_4228 [10];
  int aiStack_41d8 [12];
  long local_41a8 [26];
  double adStack_40d8 [10];
  double local_4088 [9];
  undefined1 local_4040 [8];
  double adStack_4038 [56];
  double local_3e78 [9];
  undefined1 local_3e30 [8];
  double adStack_3e28 [56];
  double local_3c68 [60];
  double local_3a88 [10];
  double adStack_3a38 [50];
  undefined1 local_38a8 [576];
  undefined1 local_3668 [80];
  undefined1 local_3618 [13800];
  
  puVar4 = local_3618;
  lVar6 = 0;
  do {
    local_41a8[lVar6] = (long)puVar4;
    lVar6 = lVar6 + 1;
    puVar4 = puVar4 + 0x228;
  } while (lVar6 != 0x19);
  memset(local_3668,0,0x3638);
  memcpy(adStack_3e28 + 0x38,State,0x240);
  WebRtcIsac_DecimateAllpass(in,State->decimator_state,0xf0,adStack_3a38 + 2);
  lVar6 = 0x48;
  do {
    adStack_3a38[1] =
         adStack_3a38[1] * 0.75 + adStack_3e28[lVar6 + 0x36] * -0.25 + adStack_3e28[lVar6 + 0x38];
    adStack_3e28[lVar6 + 0x38] = adStack_3a38[1];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xc0);
  memcpy(State,local_38a8,0x240);
  PCorr(adStack_3e28 + 0x38,local_4088);
  PCorr(local_3a88,local_3e78);
  dVar18 = log(old_lag * 0.5);
  dVar19 = old_gain * 4.0 * old_gain;
  dVar22 = 0.8;
  if (dVar19 <= 0.8) {
    dVar22 = dVar19;
  }
  lVar6 = 0;
  do {
    dVar19 = log((double)((int)lVar6 + 8));
    dVar19 = exp((dVar19 - dVar18) * (dVar19 - dVar18) * -5.0);
    local_4088[lVar6] = (dVar19 * dVar22 + 1.0) * local_4088[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x41);
  lVar6 = 0x200;
  lVar7 = 0;
  do {
    dVar22 = *(double *)((long)&DAT_001a5d40 + lVar7);
    *(double *)((long)local_4088 + lVar7) = *(double *)((long)local_4088 + lVar7) * dVar22;
    *(double *)((long)local_3e78 + lVar7) = *(double *)((long)local_3e78 + lVar7) * dVar22;
    *(double *)((long)local_4088 + lVar6) = *(double *)((long)local_4088 + lVar6) * dVar22;
    *(double *)((long)local_3e78 + lVar6) = dVar22 * *(double *)((long)local_3e78 + lVar6);
    lVar6 = lVar6 + -8;
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x18);
  lVar6 = 0;
  uVar16 = 0;
  dVar22 = 0.0;
  do {
    dVar18 = *(double *)((long)local_4088 + lVar6) + *(double *)((long)local_3e78 + lVar6);
    if (dVar22 < dVar18) {
      uVar16 = (ulong)((local_41a8[0xb] - local_41a8[0]) + 0x10 + lVar6) >> 3 & 0xffffffff;
    }
    *(double *)(local_41a8[0xb] + 0x10 + lVar6) = dVar18;
    if (dVar18 <= dVar22) {
      dVar18 = dVar22;
    }
    lVar6 = lVar6 + 8;
    dVar22 = dVar18;
  } while (lVar6 != 0x208);
  uVar9 = (local_41a8[0x16] - local_41a8[0]) + 0x68;
  lVar6 = 0;
  do {
    iVar12 = (int)lVar6;
    dVar22 = (double)(iVar12 + 0xc) / (double)(iVar12 + 0x17);
    dVar19 = dVar22 * 0.2 * (2.0 - dVar22);
    dVar22 = (local_4088[lVar6] + adStack_3e28[lVar6 + 1]) * dVar19;
    uVar11 = (ulong)(iVar12 + 2);
    if (dVar22 <= dVar18) {
      uVar11 = uVar16;
    }
    *(double *)(local_41a8[0] + 0x10 + lVar6 * 8) = dVar22;
    if (dVar22 <= dVar18) {
      dVar22 = dVar18;
    }
    dVar18 = (adStack_4038[lVar6 + 1] + local_3e78[lVar6]) * dVar19;
    *(double *)(local_41a8[0x16] + 0x68 + lVar6 * 8) = dVar18;
    lVar6 = lVar6 + 1;
    uVar16 = uVar9 >> 3 & 0xffffffff;
    if (dVar18 <= dVar22) {
      dVar18 = dVar22;
      uVar16 = uVar11;
    }
    uVar9 = uVar9 + 8;
  } while (lVar6 != 0x36);
  iVar12 = 0xc;
  lVar6 = 0;
  do {
    dVar22 = (double)iVar12 / (double)(iVar12 + 10);
    dVar19 = dVar22 * 0.9 * (2.0 - dVar22);
    dVar22 = (*(double *)((long)local_4088 + lVar6) + *(double *)((long)adStack_3e28 + lVar6)) *
             dVar19;
    *(double *)(local_41a8[1] + 0x10 + lVar6) = dVar22;
    uVar9 = (ulong)((local_41a8[1] - local_41a8[0]) + 0x10 + lVar6) >> 3 & 0xffffffff;
    if (dVar22 <= dVar18) {
      dVar22 = dVar18;
      uVar9 = uVar16;
    }
    dVar18 = (*(double *)((long)adStack_4038 + lVar6) + *(double *)((long)local_3e78 + lVar6)) *
             dVar19;
    *(double *)(local_41a8[0x15] + 0x60 + lVar6) = dVar18;
    uVar16 = (ulong)((local_41a8[0x15] - local_41a8[0]) + 0x60 + lVar6) >> 3 & 0xffffffff;
    if (dVar18 <= dVar22) {
      dVar18 = dVar22;
      uVar16 = uVar9;
    }
    iVar12 = iVar12 + 1;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x1b8);
  lVar6 = 0x58;
  lVar7 = 0x58 - local_41a8[0];
  puVar4 = local_3e30;
  lVar13 = 2;
  lVar14 = 0x1c0;
  iVar12 = 0;
  puVar15 = local_4040;
  do {
    lVar1 = local_41a8[lVar13];
    lVar2 = *(long *)((long)local_41a8 + (ulong)(uint)((0x16 - (int)lVar13) * 8));
    iVar10 = 0xc;
    lVar17 = 0;
    do {
      dVar19 = (double)iVar10 / (double)(iVar12 + iVar10 + 9);
      dVar19 = (2.0 - dVar19) * dVar19;
      dVar22 = (*(double *)((long)local_4088 + lVar17) + *(double *)(puVar4 + lVar17)) * dVar19;
      *(double *)(lVar1 + 0x10 + lVar17) = dVar22;
      uVar9 = (ulong)(lVar17 + (0x10 - local_41a8[0]) + lVar1) >> 3 & 0xffffffff;
      if (dVar22 <= dVar18) {
        dVar22 = dVar18;
        uVar9 = uVar16;
      }
      dVar18 = (*(double *)(puVar15 + lVar17) + *(double *)((long)local_3e78 + lVar17)) * dVar19;
      *(double *)(lVar2 + lVar6 + lVar17) = dVar18;
      uVar16 = (ulong)(lVar17 + lVar2 + lVar7) >> 3 & 0xffffffff;
      if (dVar18 <= dVar22) {
        dVar18 = dVar22;
        uVar16 = uVar9;
      }
      iVar10 = iVar10 + 1;
      lVar17 = lVar17 + 8;
    } while (lVar14 != lVar17);
    lVar13 = lVar13 + 1;
    lVar7 = lVar7 + -8;
    lVar6 = lVar6 + -8;
    lVar14 = lVar14 + 8;
    iVar12 = iVar12 + -1;
    puVar4 = puVar4 + -8;
    puVar15 = puVar15 + -8;
  } while (lVar13 != 0xb);
  uVar5 = 0;
  uVar9 = 1;
  lVar6 = 0x198;
  do {
    lVar7 = local_41a8[uVar9];
    lVar13 = 0;
    do {
      dVar22 = *(double *)(lVar7 + 0x20 + lVar13);
      if ((((dVar18 * 0.6 < dVar22) &&
           (pdVar8 = (double *)(lVar7 + -0x210 + lVar13), *pdVar8 <= dVar22 && dVar22 != *pdVar8))
          && (pdVar8 = (double *)(lVar7 + -0x208 + lVar13), *pdVar8 <= dVar22 && dVar22 != *pdVar8))
         && ((pdVar8 = (double *)(lVar7 + 0x248 + lVar13), *pdVar8 <= dVar22 && dVar22 != *pdVar8 &&
             (pdVar8 = (double *)(lVar7 + 0x250 + lVar13), *pdVar8 <= dVar22 && dVar22 != *pdVar8)))
         ) {
        lVar14 = (long)(int)uVar5;
        uVar5 = uVar5 + 1;
        aiStack_41d8[lVar14] = (int)((ulong)((0x20 - local_41a8[0]) + lVar7 + lVar13) >> 3);
        if (uVar5 == 10) {
          uVar5 = 10;
          break;
        }
      }
      lVar13 = lVar13 + 8;
    } while (lVar6 != lVar13);
    if (10 < uVar9) break;
    uVar9 = uVar9 + 1;
    lVar6 = lVar6 + 8;
  } while (uVar5 != 10);
  if (uVar5 != 10) {
    uVar9 = 0xc;
    lVar6 = 0;
    do {
      lVar7 = local_41a8[uVar9];
      lVar13 = lVar6;
      do {
        dVar22 = *(double *)(lVar7 + 0x28 + lVar13);
        if (((dVar18 * 0.6 < dVar22) &&
            (pdVar8 = (double *)(lVar7 + -0x208 + lVar13), *pdVar8 <= dVar22 && dVar22 != *pdVar8))
           && ((pdVar8 = (double *)(lVar7 + -0x200 + lVar13), *pdVar8 <= dVar22 && dVar22 != *pdVar8
               && ((pdVar8 = (double *)(lVar7 + 0x250 + lVar13),
                   *pdVar8 <= dVar22 && dVar22 != *pdVar8 &&
                   (pdVar8 = (double *)(lVar7 + 600 + lVar13),
                   *pdVar8 <= dVar22 && dVar22 != *pdVar8)))))) {
          lVar14 = (long)(int)uVar5;
          uVar5 = uVar5 + 1;
          aiStack_41d8[lVar14] = (int)((ulong)((0x28 - local_41a8[0]) + lVar7 + lVar13) >> 3);
          if (uVar5 == 10) {
            uVar5 = 10;
            break;
          }
        }
        lVar13 = lVar13 + 8;
      } while (lVar13 != 0x1e0);
      if (0x14 < uVar9) break;
      uVar9 = uVar9 + 1;
      lVar6 = lVar6 + 8;
    } while (uVar5 != 10);
  }
  if ((int)uVar5 < 1) {
    iVar12 = (int)uVar16;
    local_4278[0] = (double)(iVar12 % 0x45 + 6);
    local_4228[0] = (local_4278[0] + 11.0) - (double)(iVar12 / 0x45);
    if (iVar12 % 0x45 < 0xe) {
      local_4278[0] = 20.0;
    }
    if (local_4228[0] < 20.0) {
      local_4228[0] = 20.0;
    }
    if (140.0 < local_4278[0]) {
      local_4278[0] = 140.0;
    }
    if (140.0 < local_4228[0]) {
      local_4228[0] = 140.0;
    }
    *lags = local_4278[0];
    lags[1] = local_4278[0];
    pdVar8 = local_4228;
  }
  else {
    uVar16 = 0;
    do {
      iVar12 = aiStack_41d8[uVar16];
      uVar9 = (ulong)iVar12;
      pdVar8 = (double *)(local_41a8[0] + uVar9 * 8);
      dVar22 = pdVar8[-0x46];
      dVar20 = pdVar8[-0x42] * -0.0006755602864 +
               pdVar8[-0x43] * 0.02184247643159 +
               pdVar8[-0x44] * -0.12203175715679 +
               pdVar8[-0x45] * 0.6008648410116 +
               dVar22 * 0.6008648410116 +
               pdVar8[-0x47] * -0.12203175715679 +
               pdVar8[-0x48] * 0.02184247643159 + pdVar8[-0x49] * -0.0006755602864;
      dVar18 = pdVar8[-1];
      dVar19 = *pdVar8;
      dVar28 = pdVar8[1];
      dVar21 = pdVar8[3] * -0.0006755602864 +
               pdVar8[2] * 0.02184247643159 +
               dVar28 * -0.12203175715679 +
               dVar18 * 0.6008648410116 +
               pdVar8[-2] * -0.12203175715679 +
               pdVar8[-3] * 0.02184247643159 + pdVar8[-4] * -0.0006755602864 +
               dVar19 * 0.6008648410116;
      dVar30 = pdVar8[4] * -0.0006755602864 +
               pdVar8[3] * 0.02184247643159 +
               pdVar8[2] * -0.12203175715679 +
               dVar28 * 0.6008648410116 +
               dVar18 * -0.12203175715679 +
               pdVar8[-2] * 0.02184247643159 + pdVar8[-3] * -0.0006755602864 +
               dVar19 * 0.6008648410116;
      dVar23 = pdVar8[0x45];
      dVar3 = pdVar8[0x49] * -0.0006755602864 +
              pdVar8[0x48] * 0.02184247643159 +
              pdVar8[0x47] * -0.12203175715679 +
              pdVar8[0x46] * 0.6008648410116 +
              dVar23 * 0.6008648410116 +
              pdVar8[0x44] * -0.12203175715679 +
              pdVar8[0x43] * 0.02184247643159 + pdVar8[0x42] * -0.0006755602864;
      dVar24 = dVar21;
      if (dVar21 <= dVar20) {
        dVar24 = dVar20;
      }
      dVar25 = dVar30;
      if (dVar30 <= dVar24) {
        dVar25 = dVar24;
      }
      dVar24 = dVar3;
      if (dVar3 <= dVar25) {
        dVar24 = dVar25;
      }
      dVar29 = (double)(iVar12 % 0x45 + 6);
      dVar25 = (dVar29 + 11.0) - (double)(iVar12 / 0x45);
      local_4278[uVar16] = dVar29;
      local_4228[uVar16] = dVar25;
      if (dVar19 <= dVar24) {
        if ((dVar20 != dVar24) || (NAN(dVar20) || NAN(dVar24))) {
          if ((dVar21 != dVar24) || (NAN(dVar21) || NAN(dVar24))) {
            local_4278[uVar16] = dVar29 + 0.5;
            if ((dVar30 != dVar24) || (NAN(dVar30) || NAN(dVar24))) {
              local_4228[uVar16] = dVar25 + -0.5;
              dVar24 = pdVar8[0x8b];
              dVar20 = pdVar8[0x8e] * -0.0006755602864 +
                       pdVar8[0x8d] * 0.02184247643159 +
                       pdVar8[0x8c] * -0.12203175715679 +
                       pdVar8[0x8a] * 0.6008648410116 +
                       pdVar8[0x89] * -0.12203175715679 +
                       pdVar8[0x88] * 0.02184247643159 + pdVar8[0x87] * -0.0006755602864 +
                       dVar24 * 0.6008648410116;
              dVar27 = pdVar8[0x8f] * -0.0006755602864 +
                       pdVar8[0x8e] * 0.02184247643159 +
                       pdVar8[0x8d] * -0.12203175715679 +
                       pdVar8[0x8c] * 0.6008648410116 +
                       pdVar8[0x8a] * -0.12203175715679 +
                       pdVar8[0x89] * 0.02184247643159 + pdVar8[0x88] * -0.0006755602864 +
                       dVar24 * 0.6008648410116;
              dVar28 = pdVar8[0x46];
              dVar25 = dVar21;
              dVar29 = dVar19;
              dVar26 = dVar30;
              dVar30 = dVar3;
            }
            else {
              local_4228[uVar16] = dVar25 + 0.5;
              dVar24 = pdVar8[0x46];
              dVar27 = pdVar8[0x4a] * -0.0006755602864 +
                       pdVar8[0x49] * 0.02184247643159 +
                       pdVar8[0x48] * -0.12203175715679 +
                       pdVar8[0x47] * 0.6008648410116 +
                       dVar24 * 0.6008648410116 +
                       pdVar8[0x45] * -0.12203175715679 +
                       pdVar8[0x44] * 0.02184247643159 + pdVar8[0x43] * -0.0006755602864;
              dVar25 = dVar20;
              dVar29 = pdVar8[-0x45];
              dVar26 = pdVar8[-0x41] * -0.0006755602864 +
                       pdVar8[-0x42] * 0.02184247643159 +
                       pdVar8[-0x43] * -0.12203175715679 +
                       pdVar8[-0x44] * 0.6008648410116 +
                       pdVar8[-0x45] * 0.6008648410116 +
                       pdVar8[-0x46] * -0.12203175715679 +
                       pdVar8[-0x47] * 0.02184247643159 + pdVar8[-0x48] * -0.0006755602864;
              dVar20 = dVar3;
              dVar23 = dVar19;
            }
          }
          else {
            local_4278[uVar16] = dVar29 + -0.5;
            local_4228[uVar16] = dVar25 + -0.5;
            dVar25 = pdVar8[-0x43] * -0.0006755602864 +
                     pdVar8[-0x44] * 0.02184247643159 +
                     pdVar8[-0x45] * -0.12203175715679 +
                     pdVar8[-0x46] * 0.6008648410116 +
                     pdVar8[-0x47] * 0.6008648410116 +
                     pdVar8[-0x48] * -0.12203175715679 +
                     pdVar8[-0x49] * 0.02184247643159 + pdVar8[-0x4a] * -0.0006755602864;
            dVar29 = dVar22;
            dVar26 = dVar20;
            dVar27 = dVar3;
            dVar28 = dVar19;
            dVar30 = dVar21;
            dVar24 = dVar23;
            dVar20 = pdVar8[0x48] * -0.0006755602864 +
                     pdVar8[0x47] * 0.02184247643159 +
                     pdVar8[0x46] * -0.12203175715679 +
                     pdVar8[0x45] * 0.6008648410116 +
                     pdVar8[0x44] * 0.6008648410116 +
                     pdVar8[0x43] * -0.12203175715679 +
                     pdVar8[0x42] * 0.02184247643159 + pdVar8[0x41] * -0.0006755602864;
            dVar23 = dVar18;
          }
        }
        else {
          local_4278[uVar16] = dVar29 + -0.5;
          local_4228[uVar16] = dVar25 + 0.5;
          dVar18 = pdVar8[-0x8b] * 0.6008648410116;
          dVar25 = pdVar8[-0x88] * -0.0006755602864 +
                   pdVar8[-0x89] * 0.02184247643159 +
                   pdVar8[-0x8a] * -0.12203175715679 +
                   pdVar8[-0x8c] * 0.6008648410116 +
                   pdVar8[-0x8d] * -0.12203175715679 +
                   pdVar8[-0x8e] * 0.02184247643159 + pdVar8[-0x8f] * -0.0006755602864 + dVar18;
          dVar29 = pdVar8[-0x8b];
          dVar26 = pdVar8[-0x87] * -0.0006755602864 +
                   pdVar8[-0x88] * 0.02184247643159 +
                   pdVar8[-0x89] * -0.12203175715679 +
                   pdVar8[-0x8a] * 0.6008648410116 +
                   pdVar8[-0x8c] * -0.12203175715679 +
                   pdVar8[-0x8d] * 0.02184247643159 + pdVar8[-0x8e] * -0.0006755602864 + dVar18;
          dVar27 = dVar30;
          dVar28 = pdVar8[-0x45];
          dVar30 = dVar20;
          dVar24 = dVar19;
          dVar20 = dVar21;
          dVar23 = dVar22;
        }
      }
      else {
        dVar25 = dVar22;
        dVar29 = dVar20;
        dVar26 = pdVar8[-0x45];
        dVar27 = pdVar8[0x46];
        dVar28 = dVar30;
        dVar30 = dVar19;
        dVar24 = dVar3;
        dVar20 = dVar23;
        dVar23 = dVar21;
      }
      dVar22 = (dVar27 + dVar25) * 0.5 - dVar30;
      dVar19 = (dVar26 + dVar20) * 0.5 - dVar30;
      dVar18 = (((dVar30 * -4.0 + dVar24 + dVar23 + dVar29 + dVar28) - dVar22) - dVar19) * -0.5;
      dVar22 = dVar18 - dVar22;
      if (dVar22 < 1e-07) {
LAB_00160724:
        adStack_40d8[uVar16] = dVar30;
      }
      else {
        dVar3 = (((dVar28 + dVar23) - dVar29) - dVar24) * -0.5;
        dVar18 = dVar18 - dVar19;
        if (dVar22 * dVar18 - dVar3 * dVar3 < 1e-07) goto LAB_00160724;
        if (dVar22 < 0.0) {
          dVar22 = sqrt(dVar22);
        }
        else {
          dVar22 = SQRT(dVar22);
        }
        dVar3 = dVar3 / dVar22;
        dVar18 = dVar18 - dVar3 * dVar3;
        if (dVar18 < 0.0) {
          dVar18 = sqrt(dVar18);
        }
        else {
          dVar18 = SQRT(dVar18);
        }
        dVar20 = (((dVar28 + dVar24) - dVar23) - dVar29) * 0.5;
        dVar28 = (((dVar28 + dVar29) - dVar23) - dVar24) * 0.5;
        dVar19 = dVar20 / dVar22;
        dVar18 = ((dVar28 - dVar19 * dVar3) / dVar18) / dVar18;
        dVar22 = ((dVar19 - dVar3 * dVar18) * 0.5) / dVar22;
        dVar18 = dVar18 * 0.5;
        dVar19 = dVar22 * dVar22 + dVar18 * dVar18;
        if (1.0 < dVar19) {
          dVar22 = dVar22 / dVar19;
        }
        dVar18 = (double)(~-(ulong)(1.0 < dVar19) & (ulong)dVar18 |
                         (ulong)(dVar18 / dVar19) & -(ulong)(1.0 < dVar19));
        adStack_40d8[uVar16] = (dVar20 * dVar22 + dVar28 * dVar18) * 0.5 + dVar30;
        local_4278[uVar16] = dVar22 + local_4278[uVar16];
        local_4228[uVar16] = local_4228[uVar16] + dVar18;
      }
      uVar16 = uVar16 + 1;
    } while (uVar5 != uVar16);
    uVar16 = 0;
    dVar22 = 0.0;
    do {
      dVar18 = adStack_40d8[uVar16];
      dVar19 = log(local_4278[uVar16] + local_4228[uVar16]);
      dVar19 = pow(0.85,dVar19);
      dVar19 = dVar19 * dVar18;
      uVar11 = uVar9;
      if (dVar22 < dVar19) {
        uVar11 = uVar16;
      }
      uVar9 = uVar11 & 0xffffffff;
      if (dVar19 <= dVar22) {
        dVar19 = dVar22;
      }
      uVar16 = uVar16 + 1;
      dVar22 = dVar19;
    } while (uVar5 != uVar16);
    iVar12 = (int)uVar11;
    dVar18 = local_4278[iVar12] + local_4278[iVar12];
    local_4278[iVar12] = dVar18;
    dVar22 = local_4228[iVar12] + local_4228[iVar12];
    local_4228[iVar12] = dVar22;
    if (dVar18 < 20.0) {
      local_4278[iVar12] = 20.0;
    }
    pdVar8 = local_4228 + iVar12;
    if (dVar22 < 20.0) {
      *pdVar8 = 20.0;
    }
    if (140.0 < local_4278[iVar12]) {
      local_4278[iVar12] = 140.0;
    }
    if (140.0 < *pdVar8) {
      *pdVar8 = 140.0;
    }
    dVar22 = local_4278[iVar12];
    *lags = dVar22;
    lags[1] = dVar22;
  }
  dVar22 = *pdVar8;
  lags[2] = dVar22;
  lags[3] = dVar22;
  return;
}

Assistant:

void WebRtcIsac_InitializePitch(const double *in,
                                const double old_lag,
                                const double old_gain,
                                PitchAnalysisStruct *State,
                                double *lags)
{
  double buf_dec[PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2+2];
  double ratio, log_lag, gain_bias;
  double bias;
  double corrvec1[PITCH_LAG_SPAN2];
  double corrvec2[PITCH_LAG_SPAN2];
  int m, k;
  // Allocating 10 extra entries at the begining of the CorrSurf
  double corrSurfBuff[10 + (2*PITCH_BW+3)*(PITCH_LAG_SPAN2+4)];
  double* CorrSurf[2*PITCH_BW+3];
  double *CorrSurfPtr1, *CorrSurfPtr2;
  double LagWin[3] = {0.2, 0.5, 0.98};
  int ind1, ind2, peaks_ind, peak, max_ind;
  int peaks[PITCH_MAX_NUM_PEAKS];
  double adj, gain_tmp;
  double corr, corr_max;
  double intrp_a, intrp_b, intrp_c, intrp_d;
  double peak_vals[PITCH_MAX_NUM_PEAKS];
  double lags1[PITCH_MAX_NUM_PEAKS];
  double lags2[PITCH_MAX_NUM_PEAKS];
  double T[3][3];
  int row;

  for(k = 0; k < 2*PITCH_BW+3; k++)
  {
    CorrSurf[k] = &corrSurfBuff[10 + k * (PITCH_LAG_SPAN2+4)];
  }
  /* reset CorrSurf matrix */
  memset(corrSurfBuff, 0, sizeof(double) * (10 + (2*PITCH_BW+3) * (PITCH_LAG_SPAN2+4)));

  //warnings -DH
  max_ind = 0;
  peak = 0;

  /* copy old values from state buffer */
  memcpy(buf_dec, State->dec_buffer, sizeof(double) * (PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2-PITCH_FRAME_LEN/2+2));

  /* decimation; put result after the old values */
  WebRtcIsac_DecimateAllpass(in, State->decimator_state, PITCH_FRAME_LEN,
                             &buf_dec[PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2-PITCH_FRAME_LEN/2+2]);

  /* low-pass filtering */
  for (k = PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2-PITCH_FRAME_LEN/2+2; k < PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2+2; k++)
    buf_dec[k] += 0.75 * buf_dec[k-1] - 0.25 * buf_dec[k-2];

  /* copy end part back into state buffer */
  memcpy(State->dec_buffer, buf_dec+PITCH_FRAME_LEN/2, sizeof(double) * (PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2-PITCH_FRAME_LEN/2+2));

  /* compute correlation for first and second half of the frame */
  PCorr(buf_dec, corrvec1);
  PCorr(buf_dec + PITCH_CORR_STEP2, corrvec2);

  /* bias towards pitch lag of previous frame */
  log_lag = log(0.5 * old_lag);
  gain_bias = 4.0 * old_gain * old_gain;
  if (gain_bias > 0.8) gain_bias = 0.8;
  for (k = 0; k < PITCH_LAG_SPAN2; k++)
  {
    ratio = log((double) (k + (PITCH_MIN_LAG/2-2))) - log_lag;
    bias = 1.0 + gain_bias * exp(-5.0 * ratio * ratio);
    corrvec1[k] *= bias;
  }

  /* taper correlation functions */
  for (k = 0; k < 3; k++) {
    gain_tmp = LagWin[k];
    corrvec1[k] *= gain_tmp;
    corrvec2[k] *= gain_tmp;
    corrvec1[PITCH_LAG_SPAN2-1-k] *= gain_tmp;
    corrvec2[PITCH_LAG_SPAN2-1-k] *= gain_tmp;
  }

  corr_max = 0.0;
  /* fill middle row of correlation surface */
  ind1 = 0;
  ind2 = 0;
  CorrSurfPtr1 = &CorrSurf[PITCH_BW][2];
  for (k = 0; k < PITCH_LAG_SPAN2; k++) {
    corr = corrvec1[ind1++] + corrvec2[ind2++];
    CorrSurfPtr1[k] = corr;
    if (corr > corr_max) {
      corr_max = corr;  /* update maximum */
      max_ind = (int)(&CorrSurfPtr1[k] - &CorrSurf[0][0]);
    }
  }
  /* fill first and last rows of correlation surface */
  ind1 = 0;
  ind2 = PITCH_BW;
  CorrSurfPtr1 = &CorrSurf[0][2];
  CorrSurfPtr2 = &CorrSurf[2*PITCH_BW][PITCH_BW+2];
  for (k = 0; k < PITCH_LAG_SPAN2-PITCH_BW; k++) {
    ratio = ((double) (ind1 + 12)) / ((double) (ind2 + 12));
    adj = 0.2 * ratio * (2.0 - ratio);   /* adjustment factor; inverse parabola as a function of ratio */
    corr = adj * (corrvec1[ind1] + corrvec2[ind2]);
    CorrSurfPtr1[k] = corr;
    if (corr > corr_max) {
      corr_max = corr;  /* update maximum */
      max_ind = (int)(&CorrSurfPtr1[k] - &CorrSurf[0][0]);
    }
    corr = adj * (corrvec1[ind2++] + corrvec2[ind1++]);
    CorrSurfPtr2[k] = corr;
    if (corr > corr_max) {
      corr_max = corr;  /* update maximum */
      max_ind = (int)(&CorrSurfPtr2[k] - &CorrSurf[0][0]);
    }
  }
  /* fill second and next to last rows of correlation surface */
  ind1 = 0;
  ind2 = PITCH_BW-1;
  CorrSurfPtr1 = &CorrSurf[1][2];
  CorrSurfPtr2 = &CorrSurf[2*PITCH_BW-1][PITCH_BW+1];
  for (k = 0; k < PITCH_LAG_SPAN2-PITCH_BW+1; k++) {
    ratio = ((double) (ind1 + 12)) / ((double) (ind2 + 12));
    adj = 0.9 * ratio * (2.0 - ratio);   /* adjustment factor; inverse parabola as a function of ratio */
    corr = adj * (corrvec1[ind1] + corrvec2[ind2]);
    CorrSurfPtr1[k] = corr;
    if (corr > corr_max) {
      corr_max = corr;  /* update maximum */
      max_ind = (int)(&CorrSurfPtr1[k] - &CorrSurf[0][0]);
    }
    corr = adj * (corrvec1[ind2++] + corrvec2[ind1++]);
    CorrSurfPtr2[k] = corr;
    if (corr > corr_max) {
      corr_max = corr;  /* update maximum */
      max_ind = (int)(&CorrSurfPtr2[k] - &CorrSurf[0][0]);
    }
  }
  /* fill remainder of correlation surface */
  for (m = 2; m < PITCH_BW; m++) {
    ind1 = 0;
    ind2 = PITCH_BW - m;         /* always larger than ind1 */
    CorrSurfPtr1 = &CorrSurf[m][2];
    CorrSurfPtr2 = &CorrSurf[2*PITCH_BW-m][PITCH_BW+2-m];
    for (k = 0; k < PITCH_LAG_SPAN2-PITCH_BW+m; k++) {
      ratio = ((double) (ind1 + 12)) / ((double) (ind2 + 12));
      adj = ratio * (2.0 - ratio);    /* adjustment factor; inverse parabola as a function of ratio */
      corr = adj * (corrvec1[ind1] + corrvec2[ind2]);
      CorrSurfPtr1[k] = corr;
      if (corr > corr_max) {
        corr_max = corr;  /* update maximum */
        max_ind = (int)(&CorrSurfPtr1[k] - &CorrSurf[0][0]);
      }
      corr = adj * (corrvec1[ind2++] + corrvec2[ind1++]);
      CorrSurfPtr2[k] = corr;
      if (corr > corr_max) {
        corr_max = corr;  /* update maximum */
        max_ind = (int)(&CorrSurfPtr2[k] - &CorrSurf[0][0]);
      }
    }
  }

  /* threshold value to qualify as a peak */
  corr_max *= 0.6;

  peaks_ind = 0;
  /* find peaks */
  for (m = 1; m < PITCH_BW+1; m++) {
    if (peaks_ind == PITCH_MAX_NUM_PEAKS) break;
    CorrSurfPtr1 = &CorrSurf[m][2];
    for (k = 2; k < PITCH_LAG_SPAN2-PITCH_BW-2+m; k++) {
      corr = CorrSurfPtr1[k];
      if (corr > corr_max) {
        if ( (corr > CorrSurfPtr1[k - (PITCH_LAG_SPAN2+5)]) && (corr > CorrSurfPtr1[k - (PITCH_LAG_SPAN2+4)]) ) {
          if ( (corr > CorrSurfPtr1[k + (PITCH_LAG_SPAN2+4)]) && (corr > CorrSurfPtr1[k + (PITCH_LAG_SPAN2+5)]) ) {
            /* found a peak; store index into matrix */
            peaks[peaks_ind++] = (int)(&CorrSurfPtr1[k] - &CorrSurf[0][0]);
            if (peaks_ind == PITCH_MAX_NUM_PEAKS) break;
          }
        }
      }
    }
  }
  for (m = PITCH_BW+1; m < 2*PITCH_BW; m++) {
    if (peaks_ind == PITCH_MAX_NUM_PEAKS) break;
    CorrSurfPtr1 = &CorrSurf[m][2];
    for (k = 2+m-PITCH_BW; k < PITCH_LAG_SPAN2-2; k++) {
      corr = CorrSurfPtr1[k];
      if (corr > corr_max) {
        if ( (corr > CorrSurfPtr1[k - (PITCH_LAG_SPAN2+5)]) && (corr > CorrSurfPtr1[k - (PITCH_LAG_SPAN2+4)]) ) {
          if ( (corr > CorrSurfPtr1[k + (PITCH_LAG_SPAN2+4)]) && (corr > CorrSurfPtr1[k + (PITCH_LAG_SPAN2+5)]) ) {
            /* found a peak; store index into matrix */
            peaks[peaks_ind++] = (int)(&CorrSurfPtr1[k] - &CorrSurf[0][0]);
            if (peaks_ind == PITCH_MAX_NUM_PEAKS) break;
          }
        }
      }
    }
  }

  if (peaks_ind > 0) {
    /* examine each peak */
    CorrSurfPtr1 = &CorrSurf[0][0];
    for (k = 0; k < peaks_ind; k++) {
      peak = peaks[k];

      /* compute four interpolated values around current peak */
      IntrepolFilter(&CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+5)], &intrp_a);
      IntrepolFilter(&CorrSurfPtr1[peak - 1            ], &intrp_b);
      IntrepolFilter(&CorrSurfPtr1[peak                ], &intrp_c);
      IntrepolFilter(&CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+4)], &intrp_d);

      /* determine maximum of the interpolated values */
      corr = CorrSurfPtr1[peak];
      corr_max = intrp_a;
      if (intrp_b > corr_max) corr_max = intrp_b;
      if (intrp_c > corr_max) corr_max = intrp_c;
      if (intrp_d > corr_max) corr_max = intrp_d;

      /* determine where the peak sits and fill a 3x3 matrix around it */
      row = peak / (PITCH_LAG_SPAN2+4);
      lags1[k] = (double) ((peak - row * (PITCH_LAG_SPAN2+4)) + PITCH_MIN_LAG/2 - 4);
      lags2[k] = (double) (lags1[k] + PITCH_BW - row);
      if ( corr > corr_max ) {
        T[0][0] = CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+5)];
        T[2][0] = CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+4)];
        T[1][1] = corr;
        T[0][2] = CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+4)];
        T[2][2] = CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+5)];
        T[1][0] = intrp_a;
        T[0][1] = intrp_b;
        T[2][1] = intrp_c;
        T[1][2] = intrp_d;
      } else {
        if (intrp_a == corr_max) {
          lags1[k] -= 0.5;
          lags2[k] += 0.5;
          IntrepolFilter(&CorrSurfPtr1[peak - 2*(PITCH_LAG_SPAN2+5)], &T[0][0]);
          IntrepolFilter(&CorrSurfPtr1[peak - (2*PITCH_LAG_SPAN2+9)], &T[2][0]);
          T[1][1] = intrp_a;
          T[0][2] = intrp_b;
          T[2][2] = intrp_c;
          T[1][0] = CorrSurfPtr1[peak - (2*PITCH_LAG_SPAN2+9)];
          T[0][1] = CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+5)];
          T[2][1] = CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+4)];
          T[1][2] = corr;
        } else if (intrp_b == corr_max) {
          lags1[k] -= 0.5;
          lags2[k] -= 0.5;
          IntrepolFilter(&CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+6)], &T[0][0]);
          T[2][0] = intrp_a;
          T[1][1] = intrp_b;
          IntrepolFilter(&CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+3)], &T[0][2]);
          T[2][2] = intrp_d;
          T[1][0] = CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+5)];
          T[0][1] = CorrSurfPtr1[peak - 1];
          T[2][1] = corr;
          T[1][2] = CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+4)];
        } else if (intrp_c == corr_max) {
          lags1[k] += 0.5;
          lags2[k] += 0.5;
          T[0][0] = intrp_a;
          IntrepolFilter(&CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+4)], &T[2][0]);
          T[1][1] = intrp_c;
          T[0][2] = intrp_d;
          IntrepolFilter(&CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+5)], &T[2][2]);
          T[1][0] = CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+4)];
          T[0][1] = corr;
          T[2][1] = CorrSurfPtr1[peak + 1];
          T[1][2] = CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+5)];
        } else {
          lags1[k] += 0.5;
          lags2[k] -= 0.5;
          T[0][0] = intrp_b;
          T[2][0] = intrp_c;
          T[1][1] = intrp_d;
          IntrepolFilter(&CorrSurfPtr1[peak + 2*(PITCH_LAG_SPAN2+4)], &T[0][2]);
          IntrepolFilter(&CorrSurfPtr1[peak + (2*PITCH_LAG_SPAN2+9)], &T[2][2]);
          T[1][0] = corr;
          T[0][1] = CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+4)];
          T[2][1] = CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+5)];
          T[1][2] = CorrSurfPtr1[peak + (2*PITCH_LAG_SPAN2+9)];
        }
      }

      /* 2D parabolic interpolation gives more accurate lags and peak value */
      Intrpol2D(T, &lags1[k], &lags2[k], &peak_vals[k]);
    }

    /* determine the highest peak, after applying a bias towards short lags */
    corr_max = 0.0;
    for (k = 0; k < peaks_ind; k++) {
      corr = peak_vals[k] * pow(PITCH_PEAK_DECAY, log(lags1[k] + lags2[k]));
      if (corr > corr_max) {
        corr_max = corr;
        peak = k;
      }
    }

    lags1[peak] *= 2.0;
    lags2[peak] *= 2.0;

    if (lags1[peak] < (double) PITCH_MIN_LAG) lags1[peak] = (double) PITCH_MIN_LAG;
    if (lags2[peak] < (double) PITCH_MIN_LAG) lags2[peak] = (double) PITCH_MIN_LAG;
    if (lags1[peak] > (double) PITCH_MAX_LAG) lags1[peak] = (double) PITCH_MAX_LAG;
    if (lags2[peak] > (double) PITCH_MAX_LAG) lags2[peak] = (double) PITCH_MAX_LAG;

    /* store lags of highest peak in output array */
    lags[0] = lags1[peak];
    lags[1] = lags1[peak];
    lags[2] = lags2[peak];
    lags[3] = lags2[peak];
  }
  else
  {
    row = max_ind / (PITCH_LAG_SPAN2+4);
    lags1[0] = (double) ((max_ind - row * (PITCH_LAG_SPAN2+4)) + PITCH_MIN_LAG/2 - 4);
    lags2[0] = (double) (lags1[0] + PITCH_BW - row);

    if (lags1[0] < (double) PITCH_MIN_LAG) lags1[0] = (double) PITCH_MIN_LAG;
    if (lags2[0] < (double) PITCH_MIN_LAG) lags2[0] = (double) PITCH_MIN_LAG;
    if (lags1[0] > (double) PITCH_MAX_LAG) lags1[0] = (double) PITCH_MAX_LAG;
    if (lags2[0] > (double) PITCH_MAX_LAG) lags2[0] = (double) PITCH_MAX_LAG;

    /* store lags of highest peak in output array */
    lags[0] = lags1[0];
    lags[1] = lags1[0];
    lags[2] = lags2[0];
    lags[3] = lags2[0];
  }
}